

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

QPDFEFStreamObjectHelper * __thiscall
QPDFEFStreamObjectHelper::setSubtype(QPDFEFStreamObjectHelper *this,string *subtype)

{
  allocator<char> local_89;
  undefined1 local_88 [32];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_88 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/Subtype",&local_89);
  std::operator+(&local_58,"/",subtype);
  QPDFObjectHandle::newName((string *)local_88);
  QPDFObjectHandle::replaceKey
            ((QPDFObjectHandle *)(local_88 + 0x10),&local_38,(QPDFObjectHandle *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return this;
}

Assistant:

QPDFEFStreamObjectHelper&
QPDFEFStreamObjectHelper::setSubtype(std::string const& subtype)
{
    oh().getDict().replaceKey("/Subtype", QPDFObjectHandle::newName("/" + subtype));
    return *this;
}